

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O0

int IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion
              (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *upload_data,
              BUFFER_HANDLE messageBody)

{
  int iVar1;
  STRING_HANDLE handle;
  LOGGER_LOG p_Var2;
  HTTPAPIEX_HANDLE http_api_handle;
  HTTP_HEADERS_HANDLE request_header;
  char *pcVar3;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  HTTP_HEADERS_HANDLE iotHubRequestHttpHeaders;
  LOGGER_LOG l_1;
  HTTPAPIEX_HANDLE iotHubHttpApiExHandle;
  LOGGER_LOG l;
  STRING_HANDLE relativePathNotification;
  int result;
  BUFFER_HANDLE messageBody_local;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *upload_data_local;
  
  handle = STRING_construct_sprintf
                     ("/devices/%s/files/notifications/%s",upload_data->deviceId,
                      "?api-version=2016-11-14");
  if (handle == (STRING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion",0x273,1,
                "Failure constructing relative path string");
    }
    relativePathNotification._4_4_ = 0x274;
  }
  else {
    http_api_handle = createIotHubHttpApiExHandle(upload_data);
    if (http_api_handle == (HTTPAPIEX_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                  ,"IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion",0x27c,1,
                  "Failed to create the HTTPAPIEX_HANDLE for Azure IoT Hub");
      }
      relativePathNotification._4_4_ = 0x27d;
    }
    else {
      request_header = createIotHubRequestHttpHeaders(upload_data);
      if (request_header == (HTTP_HEADERS_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion",0x285,1,
                    "Failed to allocate HTTP headers for IoT Hub connection");
        }
        relativePathNotification._4_4_ = 0x286;
      }
      else {
        if (upload_data->cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) {
          pcVar3 = STRING_c_str(handle);
          iVar1 = send_http_sas_request
                            (upload_data,http_api_handle,pcVar3,request_header,messageBody,
                             (BUFFER_HANDLE)0x0);
          if (iVar1 == 0) {
            relativePathNotification._4_4_ = 0;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                        ,"IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion",0x2a6,1,
                        "unable to execute send_http_sas_request");
            }
            relativePathNotification._4_4_ = 0x2a7;
          }
        }
        else if (upload_data->cred_type - IOTHUB_CREDENTIAL_TYPE_X509 < 4) {
          pcVar3 = STRING_c_str(handle);
          iVar1 = send_http_request(http_api_handle,pcVar3,request_header,messageBody,
                                    (BUFFER_HANDLE)0x0);
          if (iVar1 == 0) {
            relativePathNotification._4_4_ = 0;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                        ,"IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion",0x299,1,
                        "unable to execute send_http_request");
            }
            relativePathNotification._4_4_ = 0x29a;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion",0x28e,1,
                      "internal error: unknown authorization Scheme");
          }
          relativePathNotification._4_4_ = 0x28f;
        }
        HTTPHeaders_Free(request_header);
      }
      HTTPAPIEX_Destroy(http_api_handle);
    }
    STRING_delete(handle);
  }
  return relativePathNotification._4_4_;
}

Assistant:

static int IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_data, BUFFER_HANDLE messageBody)
{
    int result;
    STRING_HANDLE relativePathNotification = STRING_construct_sprintf("/devices/%s/files/notifications/%s", upload_data->deviceId, API_VERSION);

    if (relativePathNotification == NULL)
    {
        LogError("Failure constructing relative path string");
        result = MU_FAILURE;
    }
    else
    {
        HTTPAPIEX_HANDLE iotHubHttpApiExHandle = createIotHubHttpApiExHandle(upload_data);

        if (iotHubHttpApiExHandle == NULL)
        {
            LogError("Failed to create the HTTPAPIEX_HANDLE for Azure IoT Hub");
            result = MU_FAILURE;
        }
        else
        {
            HTTP_HEADERS_HANDLE iotHubRequestHttpHeaders;

            if ((iotHubRequestHttpHeaders = createIotHubRequestHttpHeaders(upload_data)) == NULL)
            {
                LogError("Failed to allocate HTTP headers for IoT Hub connection");
                result = MU_FAILURE;
            }
            else
            {
                switch (upload_data->cred_type)
                {
                    default:
                    {
                        LogError("internal error: unknown authorization Scheme");
                        result = MU_FAILURE;
                        break;
                    }
                    case IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN:
                    case IOTHUB_CREDENTIAL_TYPE_X509:
                    case IOTHUB_CREDENTIAL_TYPE_X509_ECC:
                    case IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH:
                    {
                        if (send_http_request(iotHubHttpApiExHandle, STRING_c_str(relativePathNotification), iotHubRequestHttpHeaders, messageBody, NULL) != 0)
                        {
                            LogError("unable to execute send_http_request");
                            result = MU_FAILURE;
                        }
                        else
                        {
                            result = 0;
                        }
                        break;
                    }
                    case IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY:
                    {
                        if (send_http_sas_request(upload_data, iotHubHttpApiExHandle, STRING_c_str(relativePathNotification), iotHubRequestHttpHeaders, messageBody, NULL) != 0)
                        {
                            LogError("unable to execute send_http_sas_request");
                            result = MU_FAILURE;
                        }
                        else
                        {
                            result = 0;
                        }
                        break;
                    }
                }

                HTTPHeaders_Free(iotHubRequestHttpHeaders);
            }

            HTTPAPIEX_Destroy(iotHubHttpApiExHandle);
        }

        STRING_delete(relativePathNotification);
    }

    return result;
}